

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O0

int __thiscall ktx::CommandInfo::main(CommandInfo *this,int argc,char **argv)

{
  underlying_type_t<ktx::ReturnCode> uVar1;
  FatalError *error;
  exception *e;
  char **in_stack_00000250;
  int in_stack_0000025c;
  string *in_stack_00000260;
  string *in_stack_00000268;
  Command *in_stack_00000270;
  CommandInfo *in_stack_00000350;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [104];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Command::parseCommandLine
            (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_0000025c,
             in_stack_00000250);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  executeInfo(in_stack_00000350);
  uVar1 = to_underlying<ktx::ReturnCode>(SUCCESS);
  return uVar1;
}

Assistant:

int CommandInfo::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx info",
                "Prints information about the KTX2 file specified as the input-file argument.\n"
                "    The command implicitly calls validate and prints any found errors\n"
                "    and warnings to stdout.",
                argc, argv);
        executeInfo();
        return to_underlying(rc::SUCCESS);
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}